

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

void __thiscall
duckdb::QuantileCursor<signed_char>::QuantileCursor
          (QuantileCursor<signed_char> *this,WindowPartitionInput *partition)

{
  ColumnDataCollection *this_00;
  const_reference cVar1;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  this->inputs = partition->inputs;
  (this->scan).current_chunk_state.handles._M_h._M_buckets =
       &(this->scan).current_chunk_state.handles._M_h._M_single_bucket;
  (this->scan).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->scan).current_chunk_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->scan).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->scan).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scan).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  (this->scan).current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scan).current_chunk_state.properties = INVALID;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->scan).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DataChunk::DataChunk(&this->page);
  this->data = (char *)0x0;
  this->validity = (ValidityMask *)0x0;
  this_00 = this->inputs;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,
             &(partition->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  ColumnDataCollection::InitializeScan
            (this_00,&this->scan,(vector<unsigned_long,_true> *)&local_40,ALLOW_ZERO_COPY);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
  ColumnDataCollection::InitializeScanChunk(this->inputs,&this->scan,&this->page);
  cVar1 = vector<bool,_true>::get<true>(&partition->all_valid,0);
  this->all_valid = cVar1;
  return;
}

Assistant:

explicit QuantileCursor(const WindowPartitionInput &partition) : inputs(*partition.inputs) {
		D_ASSERT(partition.column_ids.size() == 1);
		inputs.InitializeScan(scan, partition.column_ids);
		inputs.InitializeScanChunk(scan, page);

		D_ASSERT(partition.all_valid.size() == 1);
		all_valid = partition.all_valid[0];
	}